

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

void Gia_SimAbsInit(Gia_SimAbsMan_t *p)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *p_00;
  uint uVar3;
  int Entry1;
  int Entry2;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  int iVar4;
  bool bVar5;
  
  p_01 = Gia_SimAbsFind(p->vValues,0);
  p_02 = Gia_SimAbsFind(p->vValues,1);
  p->vPatPairs->nSize = 0;
  uVar1 = p_01->nSize;
  uVar2 = p_02->nSize;
  printf("There are %d offset and %d onset minterms (%d pairs) and %d divisors.\n",(ulong)uVar1,
         (ulong)uVar2,(ulong)(uVar2 * uVar1),(ulong)(uint)p->nCands);
  Abc_Random(1);
  if ((int)uVar1 < 1) {
    __assert_fail("Vec_IntSize(vValue0) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x51a,"void Gia_SimAbsInit(Gia_SimAbsMan_t *)");
  }
  if (0 < (int)uVar2) {
    iVar4 = 0x40;
    while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
      p_00 = p->vPatPairs;
      uVar3 = Abc_Random(0);
      Entry1 = Vec_IntEntry(p_01,uVar3 % uVar1);
      uVar3 = Abc_Random(0);
      Entry2 = Vec_IntEntry(p_02,uVar3 % uVar2);
      Vec_IntPushTwo(p_00,Entry1,Entry2);
    }
    Vec_IntFree(p_01);
    Vec_IntFree(p_02);
    return;
  }
  __assert_fail("Vec_IntSize(vValue1) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                ,0x51b,"void Gia_SimAbsInit(Gia_SimAbsMan_t *)");
}

Assistant:

void Gia_SimAbsInit( Gia_SimAbsMan_t * p )
{
    int n, nPairsInit = 64;
    Vec_Int_t * vValue0 = Gia_SimAbsFind( p->vValues, 0 );
    Vec_Int_t * vValue1 = Gia_SimAbsFind( p->vValues, 1 );
    Vec_IntClear( p->vPatPairs );
    printf( "There are %d offset and %d onset minterms (%d pairs) and %d divisors.\n", 
        Vec_IntSize(vValue0), Vec_IntSize(vValue1), Vec_IntSize(vValue0)*Vec_IntSize(vValue1), p->nCands );
    Abc_Random( 1 );
    assert( Vec_IntSize(vValue0) > 0 );
    assert( Vec_IntSize(vValue1) > 0 );
    for ( n = 0; n < nPairsInit; n++ )
        Vec_IntPushTwo( p->vPatPairs, 
            Vec_IntEntry(vValue0, Abc_Random(0) % Vec_IntSize(vValue0)), 
            Vec_IntEntry(vValue1, Abc_Random(0) % Vec_IntSize(vValue1)) );
    Vec_IntFree( vValue0 );
    Vec_IntFree( vValue1 );
}